

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_astring.c
# Opt level: O2

void test_AString_reserve_success_enoughCapacity_fn(int _i)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *expr;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  AString string;
  
  private_ACUtilsTest_AString_constructTestString(&string,"012",0x10);
  private_ACUtilsTest_AString_reallocFail = 0;
  bVar1 = AString_reserve(&string,0);
  if (bVar1 == false) {
    pcVar6 = "Assertion \'AString_reserve(&string, 0)\' failed";
    iVar2 = 0x13b;
LAB_00120cb3:
    _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,iVar2,pcVar6,0,0);
  }
  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
              ,0x13b);
  if (string.capacity == 0x10) {
    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                ,0x13c);
    if (string.buffer == (char *)0x0) {
      string.size = 0;
      pcVar6 = (char *)0x0;
      expr = "Assertion \'_ck_x != NULL\' failed";
      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
      pcVar4 = "(void*) (string).buffer != NULL";
      pcVar5 = "(void*) (string).buffer";
    }
    else {
      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                  ,0x13c);
      pcVar6 = string.buffer;
      if (string.buffer == (char *)0x0) {
        string.size = 0x16819b;
        pcVar6 = "(null)";
      }
      else {
        iVar2 = strcmp("012",string.buffer);
        if (iVar2 == 0) {
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13c);
          if (string.size != 3) {
            pcVar6 = "strlen(\"012\")";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).size == strlen(\"012\")";
            pcVar5 = "(string).size";
            goto LAB_00120ace;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13c);
          if (private_ACUtilsTest_AString_reallocCount != 0) {
            pcVar6 = "(0)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
            iVar2 = 0x13d;
            string.size = private_ACUtilsTest_AString_reallocCount;
            goto LAB_00120dee;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13d);
          bVar1 = AString_reserve(&string,1);
          if (bVar1 == false) {
            pcVar6 = "Assertion \'AString_reserve(&string, 1)\' failed";
            iVar2 = 0x13e;
            goto LAB_00120cb3;
          }
          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                      ,0x13e);
          if (string.capacity == 0x10) {
            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                        ,0x13f);
            if (string.buffer == (char *)0x0) {
              string.size = 0;
              pcVar6 = (char *)0x0;
              expr = "Assertion \'_ck_x != NULL\' failed";
              pcVar3 = "Assertion \'%s\' failed: %s == %#x";
              pcVar4 = "(void*) (string).buffer != NULL";
              pcVar5 = "(void*) (string).buffer";
            }
            else {
              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                          ,0x13f);
              pcVar6 = string.buffer;
              if (string.buffer == (char *)0x0) {
                string.size = 0x16819b;
                pcVar6 = "(null)";
              }
              else {
                iVar2 = strcmp("012",string.buffer);
                if (iVar2 == 0) {
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x13f);
                  if (string.size != 3) {
                    pcVar6 = "strlen(\"012\")";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(string).size == strlen(\"012\")";
                    pcVar5 = "(string).size";
                    goto LAB_00120c58;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x13f);
                  if (private_ACUtilsTest_AString_reallocCount != 0) {
                    pcVar6 = "(0)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                    pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                    iVar2 = 0x140;
                    string.size = private_ACUtilsTest_AString_reallocCount;
                    goto LAB_00120dee;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x140);
                  bVar1 = AString_reserve(&string,0x10);
                  if (bVar1 == false) {
                    pcVar6 = "Assertion \'AString_reserve(&string, 16)\' failed";
                    iVar2 = 0x141;
                    goto LAB_00120cb3;
                  }
                  _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                              ,0x141);
                  if (string.capacity == 0x10) {
                    _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                ,0x142);
                    if (string.buffer == (char *)0x0) {
                      string.size = 0;
                      pcVar6 = (char *)0x0;
                      expr = "Assertion \'_ck_x != NULL\' failed";
                      pcVar3 = "Assertion \'%s\' failed: %s == %#x";
                      pcVar4 = "(void*) (string).buffer != NULL";
                      pcVar5 = "(void*) (string).buffer";
                    }
                    else {
                      _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                  ,0x142);
                      pcVar6 = string.buffer;
                      if (string.buffer == (char *)0x0) {
                        pcVar6 = "(null)";
                        string.size = 0x16819b;
                      }
                      else {
                        iVar2 = strcmp("012",string.buffer);
                        if (iVar2 == 0) {
                          _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                      ,0x142);
                          if (string.size == 3) {
                            _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                        ,0x142);
                            if (private_ACUtilsTest_AString_reallocCount == 0) {
                              _mark_point("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                                          ,0x143);
                              (*string.deallocator)(string.buffer);
                              return;
                            }
                            pcVar6 = "(0)";
                            expr = "Assertion \'_ck_x == _ck_y\' failed";
                            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                            pcVar4 = "private_ACUtilsTest_AString_reallocCount == (0)";
                            pcVar5 = "private_ACUtilsTest_AString_reallocCount";
                            iVar2 = 0x143;
                            string.size = private_ACUtilsTest_AString_reallocCount;
                            goto LAB_00120dee;
                          }
                          pcVar6 = "strlen(\"012\")";
                          expr = "Assertion \'_ck_x == _ck_y\' failed";
                          pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                          pcVar4 = "(string).size == strlen(\"012\")";
                          pcVar5 = "(string).size";
                          goto LAB_00120de9;
                        }
                        string.size = 0x15c553;
                      }
                      expr = 
                      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
                      ;
                      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
                      pcVar4 = "(string).buffer == (\"012\")";
                      pcVar5 = "(string).buffer";
                    }
                  }
                  else {
                    pcVar6 = "(16)";
                    expr = "Assertion \'_ck_x == _ck_y\' failed";
                    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
                    pcVar4 = "(string).capacity == (16)";
                    pcVar5 = "(string).capacity";
                    string.size = string.capacity;
                  }
LAB_00120de9:
                  iVar2 = 0x142;
                  goto LAB_00120dee;
                }
                string.size = 0x15c553;
              }
              expr = 
              "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
              ;
              pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
              pcVar4 = "(string).buffer == (\"012\")";
              pcVar5 = "(string).buffer";
            }
          }
          else {
            pcVar6 = "(16)";
            expr = "Assertion \'_ck_x == _ck_y\' failed";
            pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
            pcVar4 = "(string).capacity == (16)";
            pcVar5 = "(string).capacity";
            string.size = string.capacity;
          }
LAB_00120c58:
          iVar2 = 0x13f;
          goto LAB_00120dee;
        }
        string.size = 0x15c553;
      }
      expr = 
      "Assertion \'(0 && (_ck_x == NULL) && (_ck_y == NULL)) || (0 && ((_ck_x == NULL) || (_ck_y == NULL)) && (_ck_x != _ck_y)) || ((_ck_x != NULL) && (_ck_y != NULL) && (0 == strcmp(_ck_y, _ck_x)))\' failed"
      ;
      pcVar3 = "Assertion \'%s\' failed: %s == %s%s%s, %s == %s%s%s";
      pcVar4 = "(string).buffer == (\"012\")";
      pcVar5 = "(string).buffer";
    }
  }
  else {
    pcVar6 = "(16)";
    expr = "Assertion \'_ck_x == _ck_y\' failed";
    pcVar3 = "Assertion \'%s\' failed: %s == %ju, %s == %ju";
    pcVar4 = "(string).capacity == (16)";
    pcVar5 = "(string).capacity";
    string.size = string.capacity;
  }
LAB_00120ace:
  iVar2 = 0x13c;
LAB_00120dee:
  _ck_assert_failed("/workspace/llm4binary/github/license_all_cmakelists_25/Alex2804[P]ACUtils/tests/src/test_astring.c"
                    ,iVar2,expr,pcVar3,pcVar4,pcVar5,string.size,pcVar6);
}

Assistant:

START_TEST(test_AString_reserve_success_enoughCapacity)
{
    struct AString string = private_ACUtilsTest_AString_constructTestString("012", 16);
    private_ACUtilsTest_AString_setReallocFail(false, 0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 0));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 1));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    ACUTILSTEST_ASSERT(AString_reserve(&string, 16));
    ACUTILSTEST_ASTRING_CHECK_ASTRING(string, "012", 16);
    ACUTILSTEST_ASTRING_CHECK_REALLOC(0);
    private_ACUtilsTest_AString_destructTestString(string);
}